

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O3

void phits_close_file(phits_file_t ff)

{
  FILE *__stream;
  
  if (ff.internal != (void *)0x0) {
    if (*ff.internal != 0) {
      mcpl_generic_fclose(ff.internal);
    }
    free(ff.internal);
    return;
  }
  __stream = (FILE *)phits_impl_stdout_data::thefh;
  if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
    __stream = _stdout;
  }
  fprintf(__stream,"ERROR: %s\n","Invalid file object passed to phits_close_file");
  exit(1);
}

Assistant:

void phits_close_file(phits_file_t ff)
{
  phits_fileinternal_t * f = (phits_fileinternal_t *)ff.internal;
  if (!f)
    phits_error("Invalid file object passed to phits_close_file");
  if ( f->filehandle.internal ) {
    mcpl_generic_fclose( &f->filehandle );
    f->filehandle.internal = NULL;
  }
  free(f);
  ff.internal = 0;
}